

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O0

void __thiscall BVFixed::And(BVFixed *this,BVFixed *bv)

{
  BVFixed *bv_local;
  BVFixed *this_local;
  
  AssertBV(this,bv);
  for_each<void(BVUnitT<unsigned_long>::*)(BVUnitT<unsigned_long>)>(this,bv,0x4f7730);
  return;
}

Assistant:

void
BVFixed::And(const BVFixed*bv)
{
    AssertBV(bv);
    this->for_each(bv, &BVUnit::And);
}